

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionContext_AddTxInOut_Test::TestBody
          (ConfidentialTransactionContext_AddTxInOut_Test *this)

{
  AssertHelperData *pAVar1;
  pointer *ppuVar2;
  pointer *ppuVar3;
  bool bVar4;
  char cVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  char *pcVar8;
  char *in_R9;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_2;
  uint32_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  ConfidentialAssetId asset;
  OutPoint outpoint;
  Address out1_addr;
  ConfidentialTransactionContext txc;
  Address addr;
  ElementsConfidentialAddress ct_addr;
  undefined1 local_660 [16];
  undefined1 local_650 [40];
  AssertHelper local_628;
  uint local_61c;
  AssertHelper local_618;
  AssertHelper AStack_610;
  undefined1 local_608 [24];
  Script local_5f0;
  AssertHelper local_5b8;
  OutPoint local_5b0;
  ConfidentialAssetId local_588;
  void *local_558;
  void *local_540;
  void *local_528;
  code *local_510 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_498;
  Script local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  Script local_410 [3];
  undefined1 **local_358 [2];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  void *local_328;
  void *local_310;
  void *local_2f8;
  code *local_2e0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_268;
  Script local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  ElementsConfidentialAddress local_1e0 [432];
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_410,2,0);
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1e0,(string *)local_358)
  ;
  if (local_358[0] != local_348) {
    operator_delete(local_358[0]);
  }
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  ppuVar3 = (pointer *)
            ((long)&local_5f0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8);
  local_5f0._vptr_Script = (_func_int **)ppuVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_608 + 0x18),
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3","");
  cfd::core::Txid::Txid((Txid *)&local_588,(string *)(local_608 + 0x18));
  cfd::core::OutPoint::OutPoint(&local_5b0,(Txid *)&local_588,2);
  local_588._vptr_ConfidentialAssetId = (_func_int **)&PTR__Txid_002dbe60;
  if (local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
    operator_delete(local_5f0._vptr_Script);
  }
  pAVar1 = (AssertHelperData *)(local_650 + 0x10);
  local_650._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)(local_608 + 0x18),(string *)local_650);
  cfd::core::OutPoint::OutPoint((OutPoint *)&local_588,(Txid *)(local_608 + 0x18),0);
  cfd::ConfidentialTransactionContext::AddTxIn((OutPoint *)local_410);
  local_588._vptr_ConfidentialAssetId = (_func_int **)&PTR__Txid_002dbe60;
  if (local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_5f0._vptr_Script = (_func_int **)&PTR__Txid_002dbe60;
  if (local_5f0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((AssertHelperData *)local_650._0_8_ != pAVar1) {
    operator_delete((void *)local_650._0_8_);
  }
  cfd::ConfidentialTransactionContext::AddTxIn((OutPoint *)local_410);
  local_650._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_650[8] = extraout_DL;
  local_5f0._vptr_Script = (_func_int **)ppuVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_608 + 0x18),
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_588,(string *)(local_608 + 0x18));
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_410,(ConfidentialAssetId *)local_650);
  local_588._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002dc170;
  if (local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
    operator_delete(local_5f0._vptr_Script);
  }
  local_650._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_650[8] = extraout_DL_00;
  local_5f0._vptr_Script = (_func_int **)ppuVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_608 + 0x18),
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_588,(string *)(local_608 + 0x18));
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_410,(Amount *)local_1e0,
             (ConfidentialAssetId *)local_650,SUB81(&local_588,0));
  local_588._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002dc170;
  if (local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
    operator_delete(local_5f0._vptr_Script);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)(local_608 + 0x18),"txc.GetHex().c_str()",
             "\"020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000\""
             ,(char *)local_588._vptr_ConfidentialAssetId,
             "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
            );
  ppuVar2 = (pointer *)
            ((long)&local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (local_588._vptr_ConfidentialAssetId != (_func_int **)ppuVar2) {
    operator_delete(local_588._vptr_ConfidentialAssetId);
  }
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_588);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x61,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_650,(Message *)&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_650);
    if (local_588._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_588._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*local_588._vptr_ConfidentialAssetId + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)(local_608 + 0x18),"addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",(char *)local_588._vptr_ConfidentialAssetId,
             "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");
  if (local_588._vptr_ConfidentialAssetId != (_func_int **)ppuVar2) {
    operator_delete(local_588._vptr_ConfidentialAssetId);
  }
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_588);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x62,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_650,(Message *)&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_650);
    if (local_588._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_588._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*local_588._vptr_ConfidentialAssetId + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::ConfidentialTransactionContext::GetTxOutAddress((uint)&local_588,(NetType)local_410,true);
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_650,"out1_addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",(char *)local_5f0._vptr_Script,
             "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");
  if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
    operator_delete(local_5f0._vptr_Script);
  }
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)(local_608 + 0x18));
    if ((pointer)local_650._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_650._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x65,pcVar8);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)(local_608 + 0x18));
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if (local_5f0._vptr_Script != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_5f0._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_5f0._vptr_Script + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_61c = 0;
  cVar5 = cfd::ConfidentialTransactionContext::IsFindTxIn((OutPoint *)local_410,(uint *)&local_5b0);
  local_650[0] = (string)cVar5;
  local_650._8_8_ = (pointer)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)&local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_608 + 0x18),(internal *)local_650,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x68,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_618.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_618.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_650._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)(local_608 + 0x18),"index","1",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x69,pcVar8);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_650._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar5 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    ((Address *)local_410,(uint *)local_358,(vector *)&local_61c);
  local_650[0] = (string)cVar5;
  local_650._8_8_ = (pointer)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)&local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_608 + 0x18),(internal *)local_650,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6a,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_618.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_618.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_650._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)(local_608 + 0x18),"index","1",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_650._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)(local_608 + 0x18));
  uVar6 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    (local_410,(uint *)(local_608 + 0x18),(vector *)&local_61c);
  local_650[0] = (string)uVar6;
  local_650._8_8_ = (pointer)0x0;
  cfd::core::Script::~Script((Script *)(local_608 + 0x18));
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_608 + 0x18),(internal *)local_650,
               (AssertionResult *)"txc.IsFindTxOut(Script(), &index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6c,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_618.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_618.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_650._0_8_ = local_650._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)(local_608 + 0x18),"index","0",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6d,pcVar8);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_650._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar7 = cfd::ConfidentialTransactionContext::GetTxOutIndex((Address *)local_410);
  local_650._0_4_ = uVar7;
  local_618.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)(local_608 + 0x18),"txc.GetTxOutIndex(addr)","1",(uint *)local_650,
             (int *)&local_618);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6e,pcVar8);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_650._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar5 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut((uint *)local_410);
  local_650[0] = (string)cVar5;
  local_650._8_8_ = (pointer)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)&local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_608 + 0x18),(internal *)local_650,
               (AssertionResult *)"txc.IsFindFeeTxOut(&index)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6f,(char *)local_5f0._vptr_Script);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_5f0._vptr_Script != (_func_int **)ppuVar3) {
      operator_delete(local_5f0._vptr_Script);
    }
    if (local_618.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_618.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_618.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_650._0_8_ = local_650._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)(local_608 + 0x18),"index","0",&local_61c,(int *)local_650);
  if ((char)local_5f0._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_650);
    if (local_5f0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_5f0.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x70,pcVar8);
    testing::internal::AssertHelper::operator=(&local_618,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    if ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_650._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_5f0.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)(local_608 + 0x18));
  local_618.data_ =
       (AssertHelperData *)
       cfd::ConfidentialTransactionContext::GetFeeAmount((ConfidentialAssetId *)local_410);
  AStack_610.data_._0_1_ = extraout_DL_01;
  local_660._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_628.data_._0_4_ = 0x1c84;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_650,"txc.GetFeeAmount(&asset).GetSatoshiValue()","7300",
             (long *)local_660,(int *)&local_628);
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_618);
    if ((pointer)local_650._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_650._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x72,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if (local_618.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_618.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_618.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_618,"asset.GetHex().c_str()",
             "\"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225\"",
             (char *)local_650._0_8_,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  if ((AssertHelperData *)local_650._0_8_ != pAVar1) {
    operator_delete((void *)local_650._0_8_);
  }
  if (local_618.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_650);
    if (AStack_610.data_ == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)AStack_610.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x73,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_660,(Message *)local_650);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_660);
    if ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_650._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_650._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_610,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_660._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_660[8] = extraout_DL_02;
  local_618.data_ = (AssertHelperData *)local_608;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_618,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_650,(string *)&local_618);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_410,(Amount *)local_1e0,
             (ConfidentialAssetId *)local_660,SUB81(local_650,0));
  local_650._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((pointer)local_650._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_650._8_8_);
  }
  if (local_618.data_ != (AssertHelperData *)local_608) {
    operator_delete(local_618.data_);
  }
  local_618.data_ = (AssertHelperData *)0x0;
  AStack_610.data_ = (AssertHelperData *)0x0;
  local_608._0_8_ = 0;
  cVar5 = cfd::ConfidentialTransactionContext::IsFindTxOut
                    ((Address *)local_410,(uint *)local_358,(vector *)&local_61c);
  local_660[0] = cVar5;
  local_660._8_8_ = (pointer)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)&local_628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_650,(internal *)local_660,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index, &indexes)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7a,(char *)local_650._0_8_);
    testing::internal::AssertHelper::operator=(&local_5b8,(Message *)&local_628);
    testing::internal::AssertHelper::~AssertHelper(&local_5b8);
    if ((AssertHelperData *)local_650._0_8_ != pAVar1) {
      operator_delete((void *)local_650._0_8_);
    }
    if (CONCAT44(local_628.data_._4_4_,local_628.data_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_628.data_._4_4_,local_628.data_._0_4_) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_628.data_._4_4_,local_628.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_660 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_660._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_650,"index","1",&local_61c,(int *)local_660);
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)local_660);
    if ((pointer)local_650._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_650._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_660._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_660._0_8_ = (long)AStack_610.data_ - (long)local_618.data_ >> 2;
  local_628.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_650,"indexes.size()","2",(unsigned_long *)local_660,(int *)&local_628
            );
  if (local_650[0] == (string)0x0) {
    testing::Message::Message((Message *)local_660);
    if ((pointer)local_650._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_650._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_660._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_650 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)AStack_610.data_ - (long)local_618.data_ == 8) {
    local_660._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_650,"indexes[0]","1",&(local_618.data_)->type,(int *)local_660);
    if (local_650[0] == (string)0x0) {
      testing::Message::Message((Message *)local_660);
      if ((pointer)local_650._8_8_ == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_650._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7e,pcVar8);
      testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
      testing::internal::AssertHelper::~AssertHelper(&local_628);
      if ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_660._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_650 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_660._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_650,"indexes[1]","2",(uint *)&(local_618.data_)->field_0x4,
               (int *)local_660);
    if (local_650[0] == (string)0x0) {
      testing::Message::Message((Message *)local_660);
      if ((pointer)local_650._8_8_ == (pointer)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_650._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7f,pcVar8);
      testing::internal::AssertHelper::operator=(&local_628,(Message *)local_660);
      testing::internal::AssertHelper::~AssertHelper(&local_628);
      if ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && ((AssertHelperData *)local_660._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_660._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_650 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (local_618.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_618.data_);
  }
  local_5f0._vptr_Script = (_func_int **)&PTR__ConfidentialAssetId_002dc170;
  if (local_5f0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_440);
  cfd::core::Script::~Script(&local_480);
  local_510[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_498);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_510);
  if (local_528 != (void *)0x0) {
    operator_delete(local_528);
  }
  if (local_540 != (void *)0x0) {
    operator_delete(local_540);
  }
  if (local_558 != (void *)0x0) {
    operator_delete(local_558);
  }
  if (local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != &local_588.version_) {
    operator_delete(local_588.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  local_5b0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002dbe60;
  if (local_5b0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5b0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_210);
  cfd::core::Script::~Script(&local_250);
  local_2e0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_268);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_2e0);
  if (local_2f8 != (void *)0x0) {
    operator_delete(local_2f8);
  }
  if (local_310 != (void *)0x0) {
    operator_delete(local_310);
  }
  if (local_328 != (void *)0x0) {
    operator_delete(local_328);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0]);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_1e0);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_410);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddTxInOut)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(7300),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kElementsRegtest);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(Script(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);
  EXPECT_TRUE(txc.IsFindFeeTxOut(&index));
  EXPECT_EQ(index, 0);
  ConfidentialAssetId asset;
  EXPECT_EQ(txc.GetFeeAmount(&asset).GetSatoshiValue(), 7300);
  EXPECT_STREQ(asset.GetHex().c_str(), "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index, &indexes));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(indexes.size(), 2);
  if (indexes.size() == 2) {
    EXPECT_EQ(indexes[0], 1);
    EXPECT_EQ(indexes[1], 2);
  }
}